

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O3

void __thiscall
Descriptor_CreateDescriptor_wpkh_Test::~Descriptor_CreateDescriptor_wpkh_Test
          (Descriptor_CreateDescriptor_wpkh_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Descriptor, CreateDescriptor_wpkh) {
  std::string ext_descriptor = "wpkh([1422fcb3/0'/0'/68']02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995)#r5cw72t3";
  std::string parent_info = "[1422fcb3/0'/0'/68']";
  std::string pubkey_str = "02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995";
  DescriptorKeyInfo key_info;
  Descriptor desc;
  std::string desc_str = "";

  EXPECT_NO_THROW(key_info = DescriptorKeyInfo(Pubkey(pubkey_str), parent_info));
  EXPECT_NO_THROW(desc = Descriptor::CreateDescriptor(DescriptorScriptType::kDescriptorScriptWpkh, key_info));
  EXPECT_NO_THROW(desc_str = desc.ToString());
  EXPECT_STREQ(desc_str.c_str(), ext_descriptor.c_str());
  try {
    auto key = desc.GetKeyData();
    EXPECT_TRUE(key.IsValid());
    EXPECT_STREQ(key.ToString().c_str(),
      "[1422fcb3/0'/0'/68']02bedf98a38247c1718fdff7e07561b4dc15f10323ebb0accab581778e72c2e995");
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }
}